

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSIXEnvironment.h
# Opt level: O0

void __thiscall
llbuild::basic::POSIXEnvironment::setIfMissing(POSIXEnvironment *this,StringRef key,StringRef value)

{
  StringRef RHS;
  StringRef RHS_00;
  pair<std::__detail::_Node_iterator<llvm::StringRef,_true,_true>,_bool> pVar1;
  StringRef local_190;
  char *local_180;
  char *local_178;
  size_t local_170;
  size_t local_168;
  undefined1 local_160 [8];
  SmallString<256U> assignment;
  POSIXEnvironment *this_local;
  StringRef value_local;
  StringRef key_local;
  
  value_local.Data = (char *)value.Length;
  value_local.Length = (size_t)key.Data;
  if (((this->isFrozen ^ 0xffU) & 1) == 0) {
    __assert_fail("!isFrozen",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/POSIXEnvironment.h"
                  ,0x43,"void llbuild::basic::POSIXEnvironment::setIfMissing(StringRef, StringRef)")
    ;
  }
  pVar1 = std::
          unordered_set<llvm::StringRef,_std::hash<llvm::StringRef>,_std::equal_to<llvm::StringRef>,_std::allocator<llvm::StringRef>_>
          ::insert(&this->keys,(value_type *)&value_local.Length);
  assignment.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
       pVar1.first.super__Node_iterator_base<llvm::StringRef,_true>._M_cur;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_160);
    local_170 = value_local.Length;
    RHS_00.Length = key.Length;
    RHS_00.Data = (char *)value_local.Length;
    local_168 = key.Length;
    llvm::SmallString<256U>::operator+=((SmallString<256U> *)local_160,RHS_00);
    llvm::SmallString<256U>::operator+=((SmallString<256U> *)local_160,'=');
    local_178 = value_local.Data;
    RHS.Length = (size_t)value_local.Data;
    RHS.Data = value.Data;
    local_180 = value.Data;
    llvm::SmallString<256U>::operator+=((SmallString<256U> *)local_160,RHS);
    llvm::SmallString<256U>::operator+=((SmallString<256U> *)local_160,'\0');
    local_190 = llvm::SmallString<256U>::str((SmallString<256U> *)local_160);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<llvm::StringRef>(&this->envStorage,&local_190);
    llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_160);
  }
  return;
}

Assistant:

void setIfMissing(StringRef key, StringRef value) {
    assert(!isFrozen);
    if (keys.insert(key).second) {
      llvm::SmallString<256> assignment;
      assignment += key;
      assignment += '=';
      assignment += value;
      assignment += '\0';
      envStorage.emplace_back(assignment.str());
    }
  }